

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.cpp
# Opt level: O0

void multithreading(void)

{
  Header *pHVar1;
  int iVar2;
  OutputFile out;
  Header header;
  InputFile in;
  char fileName [1];
  InputFile *this;
  OutputFile local_80 [32];
  Header local_60 [56];
  InputFile local_28 [39];
  char local_1;
  
  local_1 = '\0';
  Imf_3_4::setGlobalThreadCount(4);
  iVar2 = Imf_3_4::globalThreadCount();
  this = local_28;
  Imf_3_4::InputFile::InputFile(this,&local_1,iVar2);
  pHVar1 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::Header(local_60,pHVar1);
  Imf_3_4::OutputFile::OutputFile(local_80,&local_1,local_60,2);
  Imf_3_4::OutputFile::~OutputFile(local_80);
  Imf_3_4::Header::~Header(local_60);
  Imf_3_4::InputFile::~InputFile(this);
  return;
}

Assistant:

void multithreading()
{
    #include "multithreading.cpp"
}